

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::render::trackbarSteps
               (cvui_block_t *theBlock,int theState,Rect *theShape,double theValue,
               TrackbarParams *theParams,Rect *theWorkingArea)

{
  int iVar1;
  longdouble lVar2;
  double dVar3;
  Scalar aColor;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  longdouble local_94;
  double local_88;
  double local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  longdouble local_54;
  undefined4 local_48 [2];
  cvui_block_t *local_40;
  undefined8 uStack_38;
  
  iVar1 = theWorkingArea->height / 2 + theWorkingArea->y;
  local_78 = 0x4054400000000000;
  uStack_70 = 0x4054400000000000;
  local_68 = 0x4054400000000000;
  uStack_60 = 0;
  if (((byte)theParams[0x34] & 4) == 0) {
    local_54 = (*(longdouble *)(theParams + 0x10) - *(longdouble *)theParams) / (longdouble)20.0;
  }
  else {
    local_54 = *(longdouble *)(theParams + 0x20);
  }
  local_94 = *(longdouble *)theParams;
  lVar2 = *(longdouble *)(theParams + 0x10);
  if (local_94 <= lVar2) {
    do {
      local_80 = (double)((local_94 - *(longdouble *)theParams) / (lVar2 - *(longdouble *)theParams)
                         );
      dVar3 = 1.0;
      if (local_80 <= 1.0) {
        dVar3 = local_80;
      }
      local_88 = 0.0;
      if (0.0 <= dVar3) {
        local_88 = dVar3;
      }
      local_a4 = (int)ROUND(local_88 * (double)(theShape->width + -0x1c) +
                            (double)theShape->x + 14.0);
      uStack_38 = 0;
      local_48[0] = 0x3010000;
      local_a0 = iVar1 + -3;
      local_9c = local_a4;
      local_98 = iVar1;
      local_40 = theBlock;
      cv::line(local_48,&local_9c,&local_a4,&local_78,1,8,0);
      local_94 = local_54 + local_94;
      lVar2 = *(longdouble *)(theParams + 0x10);
    } while (local_94 <= lVar2);
  }
  return;
}

Assistant:

void trackbarSteps(cvui_block_t& theBlock, int theState, cv::Rect& theShape, double theValue, const internal::TrackbarParams &theParams, cv::Rect& theWorkingArea) {
		cv::Point aBarTopLeft(theWorkingArea.x, theWorkingArea.y + theWorkingArea.height / 2);
		cv::Scalar aColor(0x51, 0x51, 0x51);

		bool aDiscrete = internal::bitsetHas(theParams.options, cvui::TRACKBAR_DISCRETE);
		long double aFixedStep = aDiscrete ? theParams.step : (theParams.max - theParams.min) / 20;

		// TODO: check min, max and step to prevent infinite loop.
		for (long double aValue = theParams.min; aValue <= theParams.max; aValue += aFixedStep) {
			int aPixelX = internal::trackbarValueToXPixel(theParams, theShape, aValue);
			cv::Point aPoint1(aPixelX, aBarTopLeft.y);
			cv::Point aPoint2(aPixelX, aBarTopLeft.y - 3);
			cv::line(theBlock.where, aPoint1, aPoint2, aColor);
		}
	}